

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Wrap.c
# Opt level: O2

void XFreeUtf8FontStruct(Display *dpy,XUtf8FontStruct *font_set)

{
  int i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 < font_set->nb_font; lVar1 = lVar1 + 1) {
    if (font_set->fonts[lVar1] != (XFontStruct *)0x0) {
      XFreeFont(dpy);
      free(font_set->font_name_list[lVar1]);
    }
  }
  free(font_set->ranges);
  free(font_set->font_name_list);
  free(font_set->fonts);
  free(font_set->encodings);
  free(font_set);
  return;
}

Assistant:

void
XFreeUtf8FontStruct(Display 	    *dpy,
		    XUtf8FontStruct *font_set) {

  int i;
  i = 0;
  while (i < font_set->nb_font) {
    if (font_set->fonts[i]) {
	XFreeFont(dpy, font_set->fonts[i]);
	free(font_set->font_name_list[i]);
    }
    i++;
  }
  free(font_set->ranges);
  free(font_set->font_name_list);
  free(font_set->fonts);
  free(font_set->encodings);
  free(font_set);
}